

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void enable_sources(vw *all,bool quiet,size_t passes,input_options *input_options)

{
  vw_ostream *pvVar1;
  options_i *poVar2;
  pointer pcVar3;
  size_t length;
  io_buf *piVar4;
  parser *ppVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char cVar9;
  bool bVar10;
  ushort uVar11;
  int iVar12;
  __pid_t _Var13;
  uint uVar14;
  int *piVar15;
  char *pcVar16;
  size_t sVar17;
  ostream *poVar18;
  long *plVar19;
  shared_data *__dest;
  char *pcVar20;
  vw_exception *pvVar21;
  undefined4 *puVar22;
  undefined1 uVar23;
  size_t sVar24;
  int f;
  socklen_t size;
  sockaddr_in address;
  int enableTKA;
  int on;
  stringstream msg;
  sockaddr_in client_address;
  stringstream __msg;
  int local_518 [2];
  sockaddr local_510;
  undefined1 local_500 [16];
  size_t local_4f0;
  undefined4 local_4e8;
  undefined4 local_4e4;
  _union_1457 local_4e0;
  long local_4d8;
  undefined1 local_4d0 [496];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  sockaddr local_2c8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [408];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  all->p->input->current = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2e0,&input_options->cache_files);
  parse_cache(all,&local_2e0,input_options->kill_cache,quiet);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e0);
  if ((all->daemon == false) && (all->active != true)) {
    piVar4 = all->p->input;
    if ((piVar4->files)._end == (piVar4->files)._begin) {
      pcVar3 = (all->data_filename)._M_dataplus._M_p;
      local_4e0.sa_handler = (__sighandler_t)local_4d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e0,pcVar3,pcVar3 + (all->data_filename)._M_string_length);
      if (!quiet) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(all->trace_message).super_ostream,"Reading datafile = ",0x13);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (&(all->trace_message).super_ostream,(char *)local_4e0.sa_handler,
                             local_4d8);
        std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
      }
      piVar4 = all->p->input;
      (**piVar4->_vptr_io_buf)(piVar4,local_4e0.sa_handler,(ulong)all->stdin_off,1);
      if ((input_options->json == false) && (input_options->dsjson != true)) {
        all->p->reader = read_features_string;
        all->p->text_reader = VW::read_lines;
      }
      else {
        if ((all->audit == false) && (all->hash_inv != true)) {
          all->p->reader = read_features_json<false>;
          all->p->text_reader = line_to_examples_json<false>;
          all->p->audit = false;
          local_2b8._0_8_ = (json_parser<false> *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<json_parser<false>,std::allocator<json_parser<false>>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 8),
                     (json_parser<false> **)local_2b8,(allocator<json_parser<false>_> *)&local_510);
        }
        else {
          all->p->reader = read_features_json<true>;
          all->p->text_reader = line_to_examples_json<true>;
          all->p->audit = true;
          local_2b8._0_8_ = (json_parser<false> *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<json_parser<true>,std::allocator<json_parser<true>>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2b8 + 8),
                     (json_parser<true> **)local_2b8,(allocator<json_parser<true>_> *)&local_510);
        }
        uVar8 = local_2b8._8_8_;
        uVar7 = local_2b8._0_8_;
        ppVar5 = all->p;
        local_2b8._0_8_ = (json_parser<false> *)0x0;
        local_2b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this = (ppVar5->jsonp).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
        (ppVar5->jsonp).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar7;
        (ppVar5->jsonp).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
        }
        all->p->decision_service_json = input_options->dsjson;
      }
      all->p->resettable = all->p->write_cache;
      if (local_4e0.sa_handler != (__sighandler_t)local_4d0) {
        operator_delete(local_4e0.sa_handler);
      }
    }
    else if (!quiet) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"ignoring text input in favor of cache input",
                 0x2b);
      cVar9 = (char)&all->trace_message;
      std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
      std::ostream::put(cVar9);
      std::ostream::flush();
    }
  }
  else {
    iVar12 = socket(2,1,0);
    all->p->bound_sock = iVar12;
    iVar12 = all->p->bound_sock;
    if (iVar12 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_4e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"socket: ",8);
      piVar15 = __errno_location();
      pcVar16 = strerror(*piVar15);
      std::operator<<((ostream *)local_4d0,pcVar16);
      std::__cxx11::stringbuf::str();
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          (&(all->trace_message).super_ostream,(char *)local_2b8._0_8_,
                           local_2b8._8_8_);
      std::endl<char,std::char_traits<char>>(poVar18);
      if ((json_parser<false> *)local_2b8._0_8_ != (json_parser<false> *)local_2a8) {
        operator_delete((void *)local_2b8._0_8_);
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_2b8);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)local_2a8,
                      (char *)CONCAT44(local_510.sa_data._2_4_,
                                       CONCAT22(local_510.sa_data._0_2_,local_510.sa_family)));
      puVar6 = (undefined1 *)
               CONCAT44(local_510.sa_data._2_4_,
                        CONCAT22(local_510.sa_data._0_2_,local_510.sa_family));
      if (puVar6 != local_500) {
        operator_delete(puVar6);
      }
      pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar21,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x153,&local_50);
      __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_4e4 = 1;
    iVar12 = setsockopt(iVar12,1,2,&local_4e4,4);
    if (iVar12 < 0) {
      pvVar1 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,"setsockopt SO_REUSEADDR: ",0x19);
      piVar15 = __errno_location();
      pcVar16 = strerror(*piVar15);
      if (pcVar16 == (char *)0x0) {
        std::ios::clear((int)pvVar1 + (int)(pvVar1->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar17 = strlen(pcVar16);
        std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,pcVar16,sVar17);
      }
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
    local_4e8 = 1;
    iVar12 = setsockopt(all->p->bound_sock,1,9,&local_4e8,4);
    if (iVar12 < 0) {
      pvVar1 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,"setsockopt SO_KEEPALIVE: ",0x19);
      piVar15 = __errno_location();
      pcVar16 = strerror(*piVar15);
      if (pcVar16 == (char *)0x0) {
        std::ios::clear((int)pvVar1 + (int)(pvVar1->super_ostream)._vptr_basic_ostream[-3]);
      }
      else {
        sVar17 = strlen(pcVar16);
        std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,pcVar16,sVar17);
      }
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
    local_510.sa_family = 2;
    local_510.sa_data[2] = '\0';
    local_510.sa_data[3] = '\0';
    local_510.sa_data[4] = '\0';
    local_510.sa_data[5] = '\0';
    poVar2 = all->options;
    local_4f0 = passes;
    local_4e0.sa_handler = (__sighandler_t)local_4d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"port","");
    iVar12 = (*poVar2->_vptr_options_i[1])(poVar2,&local_4e0);
    if (local_4e0.sa_handler != (__sighandler_t)local_4d0) {
      operator_delete(local_4e0.sa_handler);
    }
    uVar11 = 0x67ae;
    if ((char)iVar12 != '\0') {
      uVar11 = (ushort)input_options->port;
    }
    local_510.sa_data._0_2_ = uVar11 << 8 | uVar11 >> 8;
    iVar12 = bind(all->p->bound_sock,&local_510,0x10);
    if (iVar12 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_4e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"bind",4);
      piVar15 = __errno_location();
      pcVar16 = local_2b8;
      pcVar20 = strerror_r(*piVar15,pcVar16,0x100);
      if (pcVar20 == (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"errno = ",8);
        sVar17 = strlen(pcVar16);
      }
      else {
        sVar17 = 0xf;
        pcVar16 = "errno = unknown";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,pcVar16,sVar17);
      pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar21,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x169,&local_70);
      __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    iVar12 = listen(all->p->bound_sock,1);
    if (iVar12 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_4e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"listen",6);
      piVar15 = __errno_location();
      pcVar16 = local_2b8;
      pcVar20 = strerror_r(*piVar15,pcVar16,0x100);
      if (pcVar20 == (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"errno = ",8);
        sVar17 = strlen(pcVar16);
      }
      else {
        sVar17 = 0xf;
        pcVar16 = "errno = unknown";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,pcVar16,sVar17);
      pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar21,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x16d,&local_90);
      __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    poVar2 = all->options;
    local_4e0.sa_handler = (__sighandler_t)local_4d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"port_file","");
    iVar12 = (*poVar2->_vptr_options_i[1])(poVar2,&local_4e0);
    if (local_4e0.sa_handler != (__sighandler_t)local_4d0) {
      operator_delete(local_4e0.sa_handler);
    }
    if ((char)iVar12 != '\0') {
      local_2c8.sa_family = 0x10;
      local_2c8.sa_data[0] = '\0';
      local_2c8.sa_data[1] = '\0';
      iVar12 = getsockname(all->p->bound_sock,&local_510,(socklen_t *)&local_2c8);
      if (iVar12 < 0) {
        pvVar1 = &all->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,"getsockname: ",0xd);
        piVar15 = __errno_location();
        pcVar16 = strerror(*piVar15);
        if (pcVar16 == (char *)0x0) {
          std::ios::clear((int)pvVar1 + (int)(pvVar1->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar17 = strlen(pcVar16);
          std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,pcVar16,sVar17);
        }
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
      std::ofstream::ofstream(&local_4e0);
      std::ofstream::open((char *)&local_4e0,
                          (_Ios_Openmode)(input_options->port_file)._M_dataplus._M_p);
      cVar9 = std::__basic_file<char>::is_open();
      if (cVar9 == '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)local_2b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,"error writing port file: ",0x19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,(input_options->port_file)._M_dataplus._M_p,
                   (input_options->port_file)._M_string_length);
        pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar21,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                   ,0x17a,&local_b0);
        __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&local_4e0);
      std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      std::ofstream::close();
      local_4e0.sa_handler = _VTT;
      *(undefined8 *)((long)&local_4e0 + *(long *)(_VTT + -0x18)) = _pthread_mutex_unlock;
      std::filebuf::~filebuf((filebuf *)&local_4d8);
      std::ios_base::~ios_base((ios_base *)(local_4d0 + 0xe8));
    }
    if (((input_options->foreground == false) && (all->active == false)) &&
       (iVar12 = daemon(1,1), iVar12 != 0)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_4e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"daemon",6);
      piVar15 = __errno_location();
      pcVar16 = local_2b8;
      pcVar20 = strerror_r(*piVar15,pcVar16,0x100);
      if (pcVar20 == (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"errno = ",8);
        sVar17 = strlen(pcVar16);
      }
      else {
        sVar17 = 0xf;
        pcVar16 = "errno = unknown";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,pcVar16,sVar17);
      pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar21,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x185,&local_d0);
      __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    poVar2 = all->options;
    local_4e0.sa_handler = (__sighandler_t)local_4d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"pid_file","");
    iVar12 = (*poVar2->_vptr_options_i[1])(poVar2,&local_4e0);
    if (local_4e0.sa_handler != (__sighandler_t)local_4d0) {
      operator_delete(local_4e0.sa_handler);
    }
    passes = local_4f0;
    if ((char)iVar12 != '\0') {
      std::ofstream::ofstream(&local_4e0);
      std::ofstream::open((char *)&local_4e0,
                          (_Ios_Openmode)(input_options->pid_file)._M_dataplus._M_p);
      cVar9 = std::__basic_file<char>::is_open();
      if (cVar9 == '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)local_2b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2a8,"error writing pid file",0x16);
        pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar21,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                   ,0x18e,&local_f0);
        __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      _Var13 = getpid();
      plVar19 = (long *)std::ostream::operator<<(&local_4e0,_Var13);
      std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
      std::ostream::put((char)plVar19);
      std::ostream::flush();
      std::ofstream::close();
      local_4e0.sa_handler = _VTT;
      *(undefined8 *)((long)&local_4e0 + *(long *)(_VTT + -0x18)) = _pthread_mutex_unlock;
      std::filebuf::~filebuf((filebuf *)&local_4d8);
      std::ios_base::~ios_base((ios_base *)(local_4d0 + 0xe8));
    }
    if ((all->daemon == true) && (all->active == false)) {
      fclose(_stdin);
      if ((all->weights).sparse == true) {
        puVar22 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar22 = 1;
        __cxa_throw(puVar22,&int::typeinfo,0);
      }
      dense_parameters::share(&(all->weights).dense_weights,1L << ((byte)all->num_bits & 0x3f));
      __dest = (shared_data *)mmap64((void *)0x0,0xe0,3,0x21,-1,0);
      memcpy(__dest,all->sd,0xe0);
      free(all->sd);
      all->sd = __dest;
      length = all->num_children;
      local_2a8._0_8_ = (CrtAllocator *)0x0;
      local_2a8._8_8_ = (CrtAllocator *)0x0;
      local_2b8._0_8_ = (json_parser<false> *)0x0;
      local_2b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      v_array<int>::resize((v_array<int> *)local_2b8,length);
      if (length != 0) {
        sVar24 = 0;
        do {
          _Var13 = fork();
          *(__pid_t *)((long)&(((Reader *)local_2b8._0_8_)->stack_).allocator_ + sVar24 * 4) =
               _Var13;
          if (_Var13 == 0) {
            all->quiet = (bool)(all->quiet | sVar24 != 0);
            goto LAB_001eface;
          }
          sVar24 = sVar24 + 1;
        } while (length != sVar24);
      }
      memset(&local_4e0,0,0x98);
      local_4e0.sa_handler = handle_sigterm;
      sigaction(0xf,(sigaction *)&local_4e0,(sigaction *)0x0);
      iVar12 = wait(&local_4e0);
      if (got_sigterm == false) {
        do {
          if (iVar12 < 0 || length == 0) {
            uVar14 = iVar12 >> 0x1f & 6;
          }
          else {
            sVar24 = 0;
            do {
              if (iVar12 == *(int *)((long)&(((Reader *)local_2b8._0_8_)->stack_).allocator_ +
                                    sVar24 * 4)) {
                _Var13 = fork();
                *(__pid_t *)((long)&(((Reader *)local_2b8._0_8_)->stack_).allocator_ + sVar24 * 4) =
                     _Var13;
                if (_Var13 == 0) {
                  all->quiet = (bool)(all->quiet | sVar24 != 0);
                  uVar14 = 5;
                  goto LAB_001efa90;
                }
                break;
              }
              sVar24 = sVar24 + 1;
            } while (length != sVar24);
            uVar14 = 0;
          }
LAB_001efa90:
          if ((uVar14 != 6) && (uVar14 != 0)) goto LAB_001eface;
          iVar12 = wait(&local_4e0);
        } while (got_sigterm == false);
      }
      if (length != 0) {
        sVar24 = 0;
        do {
          kill(*(__pid_t *)((long)&(((Reader *)local_2b8._0_8_)->stack_).allocator_ + sVar24 * 4),
               0xf);
          sVar24 = sVar24 + 1;
        } while (length != sVar24);
      }
      VW::finish(all,true);
      exit(0);
    }
LAB_001eface:
    local_518[1] = 0x10;
    all->p->max_fd = 0;
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"calling accept",0xe);
      cVar9 = (char)&all->trace_message;
      std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar9);
      std::ostream::put(cVar9);
      std::ostream::flush();
    }
    local_518[0] = accept(all->p->bound_sock,&local_2c8,(socklen_t *)(local_518 + 1));
    if (local_518[0] < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_4e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"accept",6);
      piVar15 = __errno_location();
      pcVar16 = local_2b8;
      pcVar20 = strerror_r(*piVar15,pcVar16,0x100);
      if (pcVar20 == (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,"errno = ",8);
        sVar17 = strlen(pcVar16);
      }
      else {
        sVar17 = 0xf;
        pcVar16 = "errno = unknown";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,pcVar16,sVar17);
      pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar21,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
                 ,0x1e3,&local_110);
      __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    all->p->label_sock = local_518[0];
    all->print = print_result;
    local_4e0._0_4_ = local_518[0];
    v_array<int>::push_back(&all->final_prediction_sink,(int *)&local_4e0);
    v_array<int>::push_back(&all->p->input->files,local_518);
    iVar12 = all->p->max_fd;
    if (iVar12 < local_518[0]) {
      iVar12 = local_518[0];
    }
    all->p->max_fd = iVar12;
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"reading data from port ",0x17);
      poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&all->trace_message);
      std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
    }
    piVar15 = &all->p->max_fd;
    *piVar15 = *piVar15 + 1;
    if (all->active == true) {
      all->p->reader = read_features_string;
    }
    else {
      bVar10 = isbinary(all->p->input);
      if (bVar10) {
        all->p->reader = read_cached_features;
        all->print = binary_print_result;
      }
      else {
        all->p->reader = read_features_string;
      }
      all->p->sorted_cache = true;
    }
    uVar23 = true;
    if (all->p->write_cache == false) {
      uVar23 = (undefined1)*(undefined4 *)&all->daemon;
    }
    all->p->resettable = (bool)uVar23;
  }
  if ((1 < passes) && (all->p->resettable == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_4e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4d0,"need a cache file for multiple passes : try using --cache_file"
               ,0x3e);
    pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar21,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parser.cc"
               ,0x23e,(string *)(local_2a8 + 0x178));
    __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  piVar4 = all->p->input;
  piVar4->count = (long)(piVar4->files)._end - (long)(piVar4->files)._begin >> 2;
  if ((!quiet) && (all->daemon == false)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,"num sources = ",0xe);
    poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&all->trace_message);
    std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  return;
}

Assistant:

void enable_sources(vw& all, bool quiet, size_t passes, input_options& input_options)
{
  all.p->input->current = 0;
  parse_cache(all, input_options.cache_files, input_options.kill_cache, quiet);

  if (all.daemon || all.active)
  {
#ifdef _WIN32
    WSAData wsaData;
    int lastError = WSAStartup(MAKEWORD(2, 2), &wsaData);
    if (lastError != 0)
      THROWERRNO("WSAStartup() returned error:" << lastError);
#endif
    all.p->bound_sock = (int)socket(PF_INET, SOCK_STREAM, 0);
    if (all.p->bound_sock < 0)
    {
      stringstream msg;
      msg << "socket: " << strerror(errno);
      all.trace_message << msg.str() << endl;
      THROW(msg.str().c_str());
    }

    int on = 1;
    if (setsockopt(all.p->bound_sock, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on)) < 0)
      all.trace_message << "setsockopt SO_REUSEADDR: " << strerror(errno) << endl;

    // Enable TCP Keep Alive to prevent socket leaks
    int enableTKA = 1;
    if (setsockopt(all.p->bound_sock, SOL_SOCKET, SO_KEEPALIVE, (char*)&enableTKA, sizeof(enableTKA)) < 0)
      all.trace_message << "setsockopt SO_KEEPALIVE: " << strerror(errno) << endl;

    sockaddr_in address;
    address.sin_family = AF_INET;
    address.sin_addr.s_addr = htonl(INADDR_ANY);
    short unsigned int port = 26542;
    if (all.options->was_supplied("port"))
      port = (uint16_t)input_options.port;
    address.sin_port = htons(port);

    // attempt to bind to socket
    if (::bind(all.p->bound_sock, (sockaddr*)&address, sizeof(address)) < 0)
      THROWERRNO("bind");

    // listen on socket
    if (listen(all.p->bound_sock, 1) < 0)
      THROWERRNO("listen");

    // write port file
    if (all.options->was_supplied("port_file"))
    {
      socklen_t address_size = sizeof(address);
      if (getsockname(all.p->bound_sock, (sockaddr*)&address, &address_size) < 0)
      {
        all.trace_message << "getsockname: " << strerror(errno) << endl;
      }
      ofstream port_file;
      port_file.open(input_options.port_file.c_str());
      if (!port_file.is_open())
        THROW("error writing port file: " << input_options.port_file);

      port_file << ntohs(address.sin_port) << endl;
      port_file.close();
    }

    // background process (if foreground is not set)
    if (!input_options.foreground)
    {
      // FIXME switch to posix_spawn
      if (!all.active && daemon(1, 1))
        THROWERRNO("daemon");
    }

    // write pid file
    if (all.options->was_supplied("pid_file"))
    {
      ofstream pid_file;
      pid_file.open(input_options.pid_file.c_str());
      if (!pid_file.is_open())
        THROW("error writing pid file");

      pid_file << getpid() << endl;
      pid_file.close();
    }

    if (all.daemon && !all.active)
    {
#ifdef _WIN32
      THROW("not supported on windows");
#else
      fclose(stdin);
      // weights will be shared across processes, accessible to children
      all.weights.share(all.length());

      // learning state to be shared across children
      shared_data* sd =
          (shared_data*)mmap(0, sizeof(shared_data), PROT_READ | PROT_WRITE, MAP_SHARED | MAP_ANONYMOUS, -1, 0);
      memcpy(sd, all.sd, sizeof(shared_data));
      free(all.sd);
      all.sd = sd;

      // create children
      size_t num_children = all.num_children;
      v_array<int> children = v_init<int>();
      children.resize(num_children);
      for (size_t i = 0; i < num_children; i++)
      {
        // fork() returns pid if parent, 0 if child
        // store fork value and run child process if child
        if ((children[i] = fork()) == 0)
        {
          all.quiet |= (i > 0);
          goto child;
        }
      }

      // install signal handler so we can kill children when killed
      {
        struct sigaction sa;
        // specifically don't set SA_RESTART in sa.sa_flags, so that
        // waitid will be interrupted by SIGTERM with handler installed
        memset(&sa, 0, sizeof(sa));
        sa.sa_handler = handle_sigterm;
        sigaction(SIGTERM, &sa, nullptr);
      }

      while (true)
      {
        // wait for child to change state; if finished, then respawn
        int status;
        pid_t pid = wait(&status);
        if (got_sigterm)
        {
          for (size_t i = 0; i < num_children; i++) kill(children[i], SIGTERM);
          VW::finish(all);
          exit(0);
        }
        if (pid < 0)
          continue;
        for (size_t i = 0; i < num_children; i++)
          if (pid == children[i])
          {
            if ((children[i] = fork()) == 0)
            {
              all.quiet |= (i > 0);
              goto child;
            }
            break;
          }
      }

#endif
    }

#ifndef _WIN32
  child:
#endif
    sockaddr_in client_address;
    socklen_t size = sizeof(client_address);
    all.p->max_fd = 0;
    if (!all.quiet)
      all.trace_message << "calling accept" << endl;
    int f = (int)accept(all.p->bound_sock, (sockaddr*)&client_address, &size);
    if (f < 0)
      THROWERRNO("accept");

    all.p->label_sock = f;
    all.print = print_result;

    all.final_prediction_sink.push_back((size_t)f);

    all.p->input->files.push_back(f);
    all.p->max_fd = max(f, all.p->max_fd);
    if (!all.quiet)
      all.trace_message << "reading data from port " << port << endl;

    all.p->max_fd++;
    if (all.active)
      all.p->reader = read_features_string;
    else
    {
      if (isbinary(*(all.p->input)))
      {
        all.p->reader = read_cached_features;
        all.print = binary_print_result;
      }
      else
      {
        all.p->reader = read_features_string;
      }
      all.p->sorted_cache = true;
    }
    all.p->resettable = all.p->write_cache || all.daemon;
  }
  else
  {
    if (all.p->input->files.size() > 0)
    {
      if (!quiet)
        all.trace_message << "ignoring text input in favor of cache input" << endl;
    }
    else
    {
      string temp = all.data_filename;
      if (!quiet)
        all.trace_message << "Reading datafile = " << temp << endl;
      try
      {
        all.p->input->open_file(temp.c_str(), all.stdin_off, io_buf::READ);
      }
      catch (exception const& ex)
      {
        // when trying to fix this exception, consider that an empty temp is valid if all.stdin_off is false
        if (temp.size() != 0)
        {
          all.trace_message << "can't open '" << temp << "', sailing on!" << endl;
        }
        else
        {
          throw ex;
        }
      }

      if (input_options.json || input_options.dsjson)
      {
        // TODO: change to class with virtual method
        // --invert_hash requires the audit parser version to save the extra information.
        if (all.audit || all.hash_inv)
        {
          all.p->reader = &read_features_json<true>;
          all.p->text_reader = &line_to_examples_json<true>;
          all.p->audit = true;
          all.p->jsonp = std::make_shared<json_parser<true>>();
        }
        else
        {
          all.p->reader = &read_features_json<false>;
          all.p->text_reader = &line_to_examples_json<false>;
          all.p->audit = false;
          all.p->jsonp = std::make_shared<json_parser<false>>();
        }

        all.p->decision_service_json = input_options.dsjson;
      }
      else
      {
        all.p->reader = read_features_string;
        all.p->text_reader = VW::read_lines;
      }

      all.p->resettable = all.p->write_cache;
    }
  }

  if (passes > 1 && !all.p->resettable)
    THROW("need a cache file for multiple passes : try using --cache_file");

  all.p->input->count = all.p->input->files.size();
  if (!quiet && !all.daemon)
    all.trace_message << "num sources = " << all.p->input->files.size() << endl;
}